

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PoslistBlob(sqlite3_context *pCtx,Fts5Cursor *pCsr)

{
  int iVar1;
  u32 local_74;
  u8 *puStack_70;
  int nPoslist_1;
  u8 *pPoslist_1;
  int nByte_1;
  u8 *dummy_1;
  u8 *puStack_50;
  int nPoslist;
  u8 *pPoslist;
  int nByte;
  u8 *dummy;
  Fts5Buffer val;
  int local_20;
  int nPhrase;
  int rc;
  int i;
  Fts5Cursor *pCsr_local;
  sqlite3_context *pCtx_local;
  
  local_20 = 0;
  _rc = pCsr;
  pCsr_local = (Fts5Cursor *)pCtx;
  val.nSpace = sqlite3Fts5ExprPhraseCount(pCsr->pExpr);
  dummy = (u8 *)0x0;
  val.p = (u8 *)0x0;
  iVar1 = *(int *)((long)&((_rc->base).pVtab[1].pModule)->xColumn + 4);
  if (iVar1 == 0) {
    for (nPhrase = 0; nPhrase < val.nSpace + -1; nPhrase = nPhrase + 1) {
      pPoslist._4_4_ = sqlite3Fts5ExprPoslist(_rc->pExpr,nPhrase,(u8 **)&stack0xffffffffffffffc0);
      sqlite3Fts5BufferAppendVarint(&local_20,(Fts5Buffer *)&dummy,(long)pPoslist._4_4_);
    }
    for (nPhrase = 0; nPhrase < val.nSpace; nPhrase = nPhrase + 1) {
      dummy_1._4_4_ = sqlite3Fts5ExprPoslist(_rc->pExpr,nPhrase,&stack0xffffffffffffffb0);
      sqlite3Fts5BufferAppendBlob(&local_20,(Fts5Buffer *)&dummy,dummy_1._4_4_,puStack_50);
    }
  }
  else if (iVar1 == 2) {
    for (nPhrase = 0; local_20 == 0 && nPhrase < val.nSpace + -1; nPhrase = nPhrase + 1) {
      local_20 = sqlite3Fts5ExprPhraseCollist
                           (_rc->pExpr,nPhrase,(u8 **)&stack0xffffffffffffffa0,
                            (int *)((long)&pPoslist_1 + 4));
      sqlite3Fts5BufferAppendVarint(&local_20,(Fts5Buffer *)&dummy,(long)pPoslist_1._4_4_);
    }
    for (nPhrase = 0; local_20 == 0 && nPhrase < val.nSpace; nPhrase = nPhrase + 1) {
      local_20 = sqlite3Fts5ExprPhraseCollist
                           (_rc->pExpr,nPhrase,&stack0xffffffffffffff90,(int *)&local_74);
      sqlite3Fts5BufferAppendBlob(&local_20,(Fts5Buffer *)&dummy,local_74,puStack_70);
    }
  }
  sqlite3_result_blob((sqlite3_context *)pCsr_local,dummy,(int)val.p,sqlite3_free);
  return local_20;
}

Assistant:

static int fts5PoslistBlob(sqlite3_context *pCtx, Fts5Cursor *pCsr){
  int i;
  int rc = SQLITE_OK;
  int nPhrase = sqlite3Fts5ExprPhraseCount(pCsr->pExpr);
  Fts5Buffer val;

  memset(&val, 0, sizeof(Fts5Buffer));
  switch( ((Fts5Table*)(pCsr->base.pVtab))->pConfig->eDetail ){
    case FTS5_DETAIL_FULL:

      /* Append the varints */
      for(i=0; i<(nPhrase-1); i++){
        const u8 *dummy;
        int nByte = sqlite3Fts5ExprPoslist(pCsr->pExpr, i, &dummy);
        sqlite3Fts5BufferAppendVarint(&rc, &val, nByte);
      }

      /* Append the position lists */
      for(i=0; i<nPhrase; i++){
        const u8 *pPoslist;
        int nPoslist;
        nPoslist = sqlite3Fts5ExprPoslist(pCsr->pExpr, i, &pPoslist);
        sqlite3Fts5BufferAppendBlob(&rc, &val, nPoslist, pPoslist);
      }
      break;

    case FTS5_DETAIL_COLUMNS:

      /* Append the varints */
      for(i=0; rc==SQLITE_OK && i<(nPhrase-1); i++){
        const u8 *dummy;
        int nByte;
        rc = sqlite3Fts5ExprPhraseCollist(pCsr->pExpr, i, &dummy, &nByte);
        sqlite3Fts5BufferAppendVarint(&rc, &val, nByte);
      }

      /* Append the position lists */
      for(i=0; rc==SQLITE_OK && i<nPhrase; i++){
        const u8 *pPoslist;
        int nPoslist;
        rc = sqlite3Fts5ExprPhraseCollist(pCsr->pExpr, i, &pPoslist, &nPoslist);
        sqlite3Fts5BufferAppendBlob(&rc, &val, nPoslist, pPoslist);
      }
      break;

    default:
      break;
  }

  sqlite3_result_blob(pCtx, val.p, val.n, sqlite3_free);
  return rc;
}